

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cc
# Opt level: O3

vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
* __thiscall
assembler::Assembler::process
          (vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
           *__return_storage_ptr__,Assembler *this,VCDU *vcdu)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  _Base_ptr *pp_Var3;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *p_Var4;
  _Rb_tree<int,_std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
  *p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  uint id;
  _Base_ptr p_Var9;
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  out;
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  local_138;
  undefined1 local_120 [16];
  _Head_base<0UL,_assembler::TransportPDU_*,_false> _Stack_110;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_108;
  _Rb_tree<int,_std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
  local_d8;
  undefined1 local_a8 [8];
  _Head_base<0UL,_assembler::TransportPDU_*,_false> _Stack_a0;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_98;
  _Rb_tree<int,_std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
  local_68;
  
  local_138.
  super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  id = vcdu->data_->_M_elems[1] & 0x3f;
  if (id == 0x3f) {
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_138.
    super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_138.
    super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.
    super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    goto LAB_00122e2f;
  }
  p_Var6 = (this->vcs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var9 = &(this->vcs_)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var7 = p_Var9;
  p_Var8 = p_Var6;
  if (p_Var6 == (_Base_ptr)0x0) {
LAB_00122c5e:
    VirtualChannel::VirtualChannel((VirtualChannel *)local_a8,id);
    local_108._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_108._M_impl.super__Rb_tree_header._M_header;
    local_120._8_8_ = local_a8;
    _Stack_110._M_head_impl = _Stack_a0._M_head_impl;
    _Stack_a0._M_head_impl = (TransportPDU *)0x0;
    if (local_98._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
      p_Var4 = &local_108;
      local_108._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_108._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_108._M_impl.super__Rb_tree_header._M_header._M_right =
           local_108._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    else {
      p_Var2 = &local_98._M_impl.super__Rb_tree_header;
      local_108._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_98._M_impl.super__Rb_tree_header._M_header._M_parent;
      (local_98._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           local_108._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var4 = &local_98;
      local_108._M_impl.super__Rb_tree_header._M_node_count =
           local_98._M_impl.super__Rb_tree_header._M_node_count;
      local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_108._M_impl.super__Rb_tree_header._M_header._M_left =
           local_98._M_impl.super__Rb_tree_header._M_header._M_left;
      local_108._M_impl.super__Rb_tree_header._M_header._M_right =
           local_98._M_impl.super__Rb_tree_header._M_header._M_right;
      local_108._M_impl.super__Rb_tree_header._M_header._M_color =
           local_98._M_impl.super__Rb_tree_header._M_header._M_color;
      local_98._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      local_98._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    }
    p_Var6 = &local_d8._M_impl.super__Rb_tree_header._M_header;
    (p_Var4->_M_impl).super__Rb_tree_header._M_node_count = 0;
    if (local_68._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
      p_Var5 = &local_d8;
      local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_d8._M_impl.super__Rb_tree_header._M_header._M_right = p_Var6;
    }
    else {
      p_Var2 = &local_68._M_impl.super__Rb_tree_header;
      local_d8._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_68._M_impl.super__Rb_tree_header._M_header._M_parent;
      (local_68._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var6;
      p_Var5 = &local_68;
      local_d8._M_impl.super__Rb_tree_header._M_node_count =
           local_68._M_impl.super__Rb_tree_header._M_node_count;
      local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      p_Var6 = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
      local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_68._M_impl.super__Rb_tree_header._M_header._M_right;
      local_d8._M_impl.super__Rb_tree_header._M_header._M_color =
           local_68._M_impl.super__Rb_tree_header._M_header._M_color;
      local_68._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      local_68._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    }
    (p_Var5->_M_impl).super__Rb_tree_header._M_node_count = 0;
    local_120._0_4_ = id;
    local_d8._M_impl.super__Rb_tree_header._M_header._M_left = p_Var6;
    std::
    _Rb_tree<int,std::pair<int_const,assembler::VirtualChannel>,std::_Select1st<std::pair<int_const,assembler::VirtualChannel>>,std::less<int>,std::allocator<std::pair<int_const,assembler::VirtualChannel>>>
    ::_M_emplace_unique<std::pair<int,assembler::VirtualChannel>>
              ((_Rb_tree<int,std::pair<int_const,assembler::VirtualChannel>,std::_Select1st<std::pair<int_const,assembler::VirtualChannel>>,std::less<int>,std::allocator<std::pair<int_const,assembler::VirtualChannel>>>
                *)this,(pair<int,_assembler::VirtualChannel> *)local_120);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
    ::~_Rb_tree(&local_d8);
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&local_108);
    if (_Stack_110._M_head_impl != (TransportPDU *)0x0) {
      std::default_delete<assembler::TransportPDU>::operator()
                ((default_delete<assembler::TransportPDU> *)&_Stack_110,_Stack_110._M_head_impl);
    }
    _Stack_110._M_head_impl = (TransportPDU *)0x0;
    std::
    _Rb_tree<int,_std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
    ::~_Rb_tree(&local_68);
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&local_98);
    if (_Stack_a0._M_head_impl != (TransportPDU *)0x0) {
      std::default_delete<assembler::TransportPDU>::operator()
                ((default_delete<assembler::TransportPDU> *)&_Stack_a0,_Stack_a0._M_head_impl);
    }
    p_Var6 = (this->vcs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  }
  else {
    do {
      p_Var1 = p_Var8 + 1;
      if ((int)id <= (int)p_Var1->_M_color) {
        p_Var7 = p_Var8;
      }
      pp_Var3 = &p_Var8->_M_left;
      p_Var8 = pp_Var3[(int)p_Var1->_M_color < (int)id];
    } while (pp_Var3[(int)p_Var1->_M_color < (int)id] != (_Base_ptr)0x0);
    if ((p_Var7 == p_Var9) || ((int)id < (int)p_Var7[1]._M_color)) goto LAB_00122c5e;
  }
  p_Var7 = p_Var9;
  if (p_Var6 != (_Base_ptr)0x0) {
    do {
      if ((int)id <= (int)p_Var6[1]._M_color) {
        p_Var7 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < (int)id];
    } while (p_Var6 != (_Base_ptr)0x0);
    if ((p_Var7 != p_Var9) && ((int)p_Var7[1]._M_color <= (int)id)) {
      p_Var9 = p_Var7;
    }
  }
  VirtualChannel::process(__return_storage_ptr__,(VirtualChannel *)&p_Var9[1]._M_parent,vcdu);
LAB_00122e2f:
  std::
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  ::~vector(&local_138);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::unique_ptr<SessionPDU>> Assembler::process(const VCDU& vcdu) {
  std::vector<std::unique_ptr<SessionPDU>> out;

  // Ignore fill packets
  auto vcid = vcdu.getVCID();
  if (vcid == 63) {
    return out;
  }

  // Create virtual channel instance if it does not yet exist
  if (vcs_.find(vcid) == vcs_.end()) {
    vcs_.insert(std::make_pair(vcid, VirtualChannel(vcid)));
  }

  // Let virtual channel process VCDU
  auto it = vcs_.find(vcid);
  return it->second.process(vcdu);
}